

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

void __thiscall Alice::PermuteData(Alice *this)

{
  allocator<std::vector<long,_std::allocator<long>_>_> *this_00;
  allocator<DataElement> *this_01;
  int iVar1;
  value_type vVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Server *this_02;
  reference pvVar6;
  ostream *poVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference this_03;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *pvVar11;
  vector<int,_std::allocator<int>_> *this_04;
  vector<DataElement,_std::allocator<DataElement>_> local_100;
  int local_e8;
  int local_e4;
  int j_1;
  int i_1;
  int j;
  int i;
  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  local_d0;
  DataElement *local_c8;
  __normal_iterator<DataElement_*,_std::vector<DataElement,_std::allocator<DataElement>_>_> local_c0
  ;
  vector<DataElement,_std::allocator<DataElement>_> local_b8;
  allocator<DataElement> local_99;
  undefined1 local_98 [8];
  vector<DataElement,_std::allocator<DataElement>_> Temp;
  undefined1 local_78 [8];
  vector<DataElement,_std::allocator<DataElement>_> V;
  undefined1 local_58 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  S;
  allocator<std::vector<long,_std::allocator<long>_>_> local_29;
  undefined1 local_28 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  Pi_R_D;
  Alice *this_local;
  
  iVar1 = (this->super_Party).n_d;
  Pi_R_D.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<std::vector<long,_std::allocator<long>_>_>::allocator(&local_29);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_28,(long)iVar1,&local_29);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::~allocator(&local_29);
  iVar1 = (this->super_Party).n_d;
  this_00 = (allocator<std::vector<long,_std::allocator<long>_>_> *)
            ((long)&V.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::allocator(this_00);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_58,(long)iVar1,this_00);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::~allocator
            ((allocator<std::vector<long,_std::allocator<long>_>_> *)
             ((long)&V.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar1 = (this->super_Party).n_d;
  this_01 = (allocator<DataElement> *)
            ((long)&Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<DataElement>::allocator(this_01);
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_78,(long)iVar1,this_01);
  std::allocator<DataElement>::~allocator
            ((allocator<DataElement> *)
             ((long)&Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar1 = (this->super_Party).n_d;
  std::allocator<DataElement>::allocator(&local_99);
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_98,(long)iVar1,&local_99);
  std::allocator<DataElement>::~allocator(&local_99);
  Server::ReceiveDataVector(&local_b8,this->srv);
  std::vector<DataElement,_std::allocator<DataElement>_>::operator=
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_78,&local_b8);
  std::vector<DataElement,_std::allocator<DataElement>_>::~vector(&local_b8);
  local_c0._M_current =
       (DataElement *)
       std::vector<DataElement,_std::allocator<DataElement>_>::begin
                 ((vector<DataElement,_std::allocator<DataElement>_> *)local_78);
  local_c8 = (DataElement *)
             std::vector<DataElement,_std::allocator<DataElement>_>::end
                       ((vector<DataElement,_std::allocator<DataElement>_> *)local_78);
  std::vector<DataElement,std::allocator<DataElement>>::
  assign<__gnu_cxx::__normal_iterator<DataElement*,std::vector<DataElement,std::allocator<DataElement>>>,void>
            ((vector<DataElement,std::allocator<DataElement>> *)local_98,local_c0,
             (__normal_iterator<DataElement_*,_std::vector<DataElement,_std::allocator<DataElement>_>_>
              )local_c8);
  pvVar11 = &(this->super_Party).D;
  local_d0._M_current =
       (vector<long,_std::allocator<long>_> *)
       std::
       vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
       ::begin(pvVar11);
  _j = std::
       vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
       ::end(pvVar11);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  assign<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>,void>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)local_58,local_d0,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )_j);
  std::operator<<((ostream *)&std::cout,"Permutation Pi_A: ");
  for (i_1 = 0; i_1 < (this->super_Party).n_d; i_1 = i_1 + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&(this->super_Party).Pi_D,(long)i_1)
    ;
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar6);
    std::operator<<(poVar7," ");
    for (j_1 = 0; j_1 < 2; j_1 = j_1 + 1) {
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             *)local_58,(long)i_1);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,(long)j_1);
      vVar2 = *pvVar9;
      this_04 = &(this->super_Party).Pi_D;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_04,(long)i_1);
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&(this->super_Party).D,(long)*pvVar6);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,(long)j_1);
      *pvVar9 = vVar2;
      pvVar10 = std::vector<DataElement,_std::allocator<DataElement>_>::operator[]
                          ((vector<DataElement,_std::allocator<DataElement>_> *)local_98,(long)i_1);
      lVar3 = pvVar10->val[j_1];
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_04,(long)i_1);
      pvVar10 = std::vector<DataElement,_std::allocator<DataElement>_>::operator[]
                          ((vector<DataElement,_std::allocator<DataElement>_> *)local_78,
                           (long)*pvVar6);
      pvVar10->val[j_1] = lVar3;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_04,(long)i_1);
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             *)local_28,(long)*pvVar6);
      this_03 = std::
                vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ::operator[](&(this->super_Party).R_D,(long)i_1);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](this_03,(long)j_1);
      std::vector<long,_std::allocator<long>_>::push_back(pvVar8,pvVar9);
    }
  }
  std::operator<<((ostream *)&std::cout,"\nAlice\'s Permuted Data D_A:\n ");
  for (local_e4 = 0; local_e4 < (this->super_Party).n_d; local_e4 = local_e4 + 1) {
    for (local_e8 = 0; local_e8 < 2; local_e8 = local_e8 + 1) {
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&(this->super_Party).U_D,(long)local_e4);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,(long)local_e8);
      lVar3 = *pvVar9;
      pvVar11 = &(this->super_Party).D;
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](pvVar11,(long)local_e4);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,(long)local_e8);
      *pvVar9 = *pvVar9 + lVar3;
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](pvVar11,(long)local_e4);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,(long)local_e8);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar9);
      std::operator<<(poVar7," ");
      pvVar10 = std::vector<DataElement,_std::allocator<DataElement>_>::operator[]
                          ((vector<DataElement,_std::allocator<DataElement>_> *)local_78,
                           (long)local_e4);
      lVar3 = pvVar10->val[local_e8];
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             *)local_28,(long)local_e4);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,(long)local_e8);
      lVar4 = *pvVar9;
      pvVar8 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&(this->super_Party).U_D,(long)local_e4);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](pvVar8,(long)local_e8);
      lVar5 = *pvVar9;
      pvVar10 = std::vector<DataElement,_std::allocator<DataElement>_>::operator[]
                          ((vector<DataElement,_std::allocator<DataElement>_> *)local_78,
                           (long)local_e4);
      pvVar10->val[local_e8] = (lVar3 - lVar4) - lVar5;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  this_02 = this->srv;
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            (&local_100,(vector<DataElement,_std::allocator<DataElement>_> *)local_78);
  Server::SendDataVector(this_02,&local_100,(this->super_Party).n_p);
  std::vector<DataElement,_std::allocator<DataElement>_>::~vector(&local_100);
  std::vector<DataElement,_std::allocator<DataElement>_>::~vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_98);
  std::vector<DataElement,_std::allocator<DataElement>_>::~vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_78);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_58);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_28);
  return;
}

Assistant:

void Alice::PermuteData()
{
    std::vector<std::vector<long>> Pi_R_D(n_d), S(n_d);
    std::vector<DataElement> V(n_d), Temp(n_d);
    V = srv->ReceiveDataVector();    //receive Bob's masked share of D
    Temp.assign(V.begin(), V.end());
    S.assign(D.begin(), D.end());
    std::cout<<"Permutation Pi_A: ";
    for(int i=0; i < n_d; i++)
    {
        std::cout<<Pi_D[i]<<" ";
        for(int j=0;  j < 2; j++)
        {
            D[Pi_D[i]][j] = S[i][j]; //Applying Pi on Alice's Share of D
            V[Pi_D[i]].val[j] = Temp[i].val[j]; //Applying Pi on Bob's masked Share of D
            Pi_R_D[Pi_D[i]].push_back(R_D[i][j]);  //Prepping shuffle vector needed for resplit
        }
    }
    std::cout<<"\nAlice's Permuted Data D_A:\n ";
    for(int i=0; i < n_d; i++)
    {
        for(int j=0;  j < 2; j++)
        {
            D[i][j] += U_D[i][j];   //resplitting Alice's share of D
            std::cout<<D[i][j]<<" ";
            V[i].val[j] = V[i].val[j] - Pi_R_D[i][j] - U_D[i][j]; //resplitting Bob's share of D
        }
        std::cout<<std::endl;
    }
    srv->SendDataVector(V, n_p); //sending Bob his BlindPermuted share of D
}